

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O3

void __thiscall luna::GC::MinorGC(GC *this)

{
  uint uVar1;
  GC *this_00;
  
  uVar1 = (this->gen1_).count_;
  MinorGCMark(this);
  MinorGCSweep(this);
  this_00 = (GC *)&this->barriered_;
  std::deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::clear
            ((deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_> *)this_00);
  AdjustThreshold(this_00,(this->gen1_).count_ - uVar1,&this->gen0_,0x200,0x800);
  return;
}

Assistant:

void GC::MinorGC()
    {
        unsigned int old_gen1_count = gen1_.count_;

        MinorGCMark();
        MinorGCSweep();

        barriered_.clear();

        // Caculate objects count from gen0_ to gen1_, which is how
        // many alived objects in gen0_ after mark-sweep, and adjust
        // gen0_'s threshold count by the alived_gen0_count
        unsigned int alived_gen0_count = gen1_.count_ - old_gen1_count;
        AdjustThreshold(alived_gen0_count, gen0_, kGen0InitThresholdCount,
                        kGen0MaxThresholdCount);
    }